

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

Node * __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::CreateSurrogatePairAtom
          (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this,char16 lower,char16 upper)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar1;
  MatchLiteralNode *this_00;
  undefined1 local_e8 [8];
  MatchCharNode upperNode;
  MatchCharNode lowerNode;
  TrackAllocData local_48;
  MatchLiteralNode *local_20;
  MatchLiteralNode *literalNode;
  char16 upper_local;
  Parser<NullTerminatedUnicodeEncodingPolicy,_true> *pPStack_10;
  char16 lower_local;
  Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this_local;
  
  pAVar1 = &this->ctAllocator->
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  literalNode._4_2_ = upper;
  literalNode._6_2_ = lower;
  pPStack_10 = this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&MatchLiteralNode::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
             ,0x170);
  pAVar1 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar1,&local_48);
  this_00 = (MatchLiteralNode *)new<Memory::ArenaAllocator>(0x48,(ArenaAllocator *)pAVar1,0x3f67b0);
  MatchLiteralNode::MatchLiteralNode(this_00,0,0);
  local_20 = this_00;
  MatchCharNode::MatchCharNode((MatchCharNode *)&upperNode.isEquivClass,literalNode._6_2_);
  MatchCharNode::MatchCharNode((MatchCharNode *)local_e8,literalNode._4_2_);
  AccumLiteral(this,local_20,(Node *)&upperNode.isEquivClass);
  AccumLiteral(this,local_20,(Node *)local_e8);
  return &local_20->super_Node;
}

Assistant:

Node* Parser<P, IsLiteral>::CreateSurrogatePairAtom(char16 lower, char16 upper)
    {
        MatchLiteralNode * literalNode = Anew(this->ctAllocator, MatchLiteralNode, 0, 0);
        MatchCharNode lowerNode(lower);
        MatchCharNode upperNode(upper);
        AccumLiteral(literalNode, &lowerNode);
        AccumLiteral(literalNode, &upperNode);

        return literalNode;
    }